

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O1

int amqpvalue_get_boolean(AMQP_VALUE value,_Bool *bool_value)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  AMQP_VALUE_DATA *value_data;
  
  if (value == (AMQP_VALUE)0x0 || bool_value == (_Bool *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0xfe;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_boolean",0xfd,1,"Bad arguments: value = %p, bool_value = %p",value,
                bool_value);
    }
  }
  else if (value->type == AMQP_TYPE_BOOL) {
    *bool_value = (_Bool)(value->value).ubyte_value;
    iVar2 = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x107;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_boolean",0x106,1,"Value is not of type bool");
    }
  }
  return iVar2;
}

Assistant:

int amqpvalue_get_boolean(AMQP_VALUE value, bool* bool_value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_009: [If any of the arguments is NULL then amqpvalue_get_boolean shall return a non-zero value.] */
    if ((value == NULL) ||
        (bool_value == NULL))
    {
        LogError("Bad arguments: value = %p, bool_value = %p",
            value, bool_value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        /* Codes_SRS_AMQPVALUE_01_011: [If the type of the value is not Boolean, then amqpvalue_get_boolean shall return a non-zero value.] */
        if (value_data->type != AMQP_TYPE_BOOL)
        {
            LogError("Value is not of type bool");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_008: [amqpvalue_get_boolean shall fill in the bool_value argument the Boolean value stored by the AMQP value indicated by the value argument.] */
            *bool_value = value_data->value.bool_value;

            /* Codes_SRS_AMQPVALUE_01_010: [On success amqpvalue_get_boolean shall return 0.] */
            result = 0;
        }
    }

    return result;
}